

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

string * __thiscall
cmCTestRunTest::GetTestPrefix_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestRunTest *this,size_t completed,size_t total)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ostringstream outputStream;
  ostringstream indexStr;
  long *local_330;
  long local_328;
  long local_320 [2];
  undefined1 local_310 [112];
  ios_base local_2a0 [264];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  lVar4 = 1;
  uVar3 = total;
  if (9 < total) {
    do {
      lVar4 = lVar4 + 1;
      bVar1 = 99 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar1);
  }
  *(long *)(*(_func_int **)(local_310._0_8_ + -0x18) + (long)(local_310 + 0x10)) = lVar4;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_310);
  lVar4 = 1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
  if (9 < total) {
    lVar4 = 1;
    do {
      lVar4 = lVar4 + 1;
      bVar1 = 99 < total;
      total = total / 10;
    } while (bVar1);
  }
  *(long *)(*(_func_int **)(local_310._0_8_ + -0x18) + (long)(local_310 + 0x10)) = lVar4;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_310);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  bVar1 = this->TestHandler->MemCheck;
  pcVar5 = "Test";
  if (bVar1 != false) {
    pcVar5 = "MemCheck";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,pcVar5,(ulong)bVar1 * 4 + 4);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," #",2);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  uVar3 = (ulong)this->TestHandler->MaxIndex;
  lVar4 = 4;
  if (9 < uVar3) {
    do {
      lVar4 = lVar4 + 1;
      bVar1 = 99 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar1);
  }
  *(long *)(*(_func_int **)(local_310._0_8_ + -0x18) + (long)(local_310 + 0x10)) = lVar4;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,(char *)local_330,local_328);
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310," ",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  std::ios_base::~ios_base((ios_base *)(local_310 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestRunTest::GetTestPrefix(size_t completed, size_t total) const
{
  std::ostringstream outputStream;
  outputStream << std::setw(getNumWidth(total)) << completed << "/";
  outputStream << std::setw(getNumWidth(total)) << total << " ";

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  return outputStream.str();
}